

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall
mkvparser::Track::Track(Track *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  this->_vptr_Track = (_func_int **)&PTR__Track_00544338;
  this->m_pSegment = pSegment;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  Info::Info(&this->m_info);
  EOSBlock::EOSBlock(&this->m_eos);
  this->content_encoding_entries_ = (ContentEncoding **)0x0;
  this->content_encoding_entries_end_ = (ContentEncoding **)0x0;
  return;
}

Assistant:

Track::Track(Segment* pSegment, long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_element_start(element_start),
      m_element_size(element_size),
      content_encoding_entries_(NULL),
      content_encoding_entries_end_(NULL) {}